

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall
xray_re::se_sim_faction::state_read(se_sim_faction *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  bool bVar2;
  uchar uVar3;
  unsigned_short uVar4;
  
  cse_alife_smart_zone::state_read(&this->super_cse_alife_smart_zone,packet,size);
  uVar1 = (this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
          super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version;
  if (uVar1 < 0x7a) {
    if ((uVar1 != 0x65) && (uVar1 != 0x76)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x261,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    return;
  }
  if (0x7c < uVar1) {
    __assert_fail("m_version <= CSE_VERSION_CS",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x24c,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)");
  }
  cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_sim_faction");
  bVar2 = xr_packet::r_bool(packet);
  if (bVar2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x24f,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)");
  }
  bVar2 = xr_packet::r_bool(packet);
  if (bVar2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x251,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)");
  }
  uVar3 = xr_packet::r<unsigned_char>(packet);
  if (uVar3 != '\0') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x253,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)");
  }
  r_ctime(packet);
  uVar3 = xr_packet::r<unsigned_char>(packet);
  if (uVar3 != '\0') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x256,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)");
  }
  uVar3 = xr_packet::r<unsigned_char>(packet);
  if (uVar3 == '\0') {
    uVar3 = xr_packet::r<unsigned_char>(packet);
    if (uVar3 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x25a,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)"
                   );
    }
    uVar4 = xr_packet::r<unsigned_short>(packet);
    if (uVar4 == 0) {
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"se_sim_faction");
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x25c,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)");
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                ,600,"virtual void xray_re::se_sim_faction::state_read(xr_packet &, uint16_t)");
}

Assistant:

void se_sim_faction::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_smart_zone::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		set_save_marker(packet, SM_LOAD, false, "se_sim_faction");
		if (packet.r_bool())		// community_player
			xr_not_implemented();
		if (packet.r_bool())		// start_position_filled
			xr_not_implemented();
		if (packet.r_u8())		// current_expansion_level
			xr_not_implemented();
		r_ctime(packet);		// last_spawn_time
		if (packet.r_u8())		// #squad_target_cache
			xr_not_implemented();
		if (packet.r_u8())		// #random_tasks
			xr_not_implemented();
		if (packet.r_u8())		// #current_attack_quantity
			xr_not_implemented();
		if (packet.r_u16())		// #squads
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "se_sim_faction");
	} else if (m_version == CSE_VERSION_SOC || m_version == CSE_VERSION_2215) {
		// stub
	} else {
		xr_not_implemented();
	}
}